

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayQueryFunction::DimResult::DimResult
          (DimResult *this,AssociativeArray *map,Type *indexType)

{
  AssociativeArray::AssociativeArray(&this->map,map);
  this->indexType = indexType;
  (this->range).left = 0;
  (this->range).right = 0;
  *(undefined4 *)((long)&(this->range).right + 3) = 0;
  return;
}

Assistant:

DimResult(AssociativeArray&& map, const Type* indexType) :
            map(std::move(map)), indexType(indexType) {}